

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall
skiwi::anon_unknown_23::lambda_variable_arity_not_using_rest_arg::
~lambda_variable_arity_not_using_rest_arg(lambda_variable_arity_not_using_rest_arg *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10 20)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10 20 30)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10 20 30 40)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10 20 30 40 50)) "));
      TEST_EQ("12", run("(let([f(lambda args 12)]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("12", run("(let([f(lambda (a0 . args) 12)]) (f 10)) "));
      TEST_EQ("10", run("(let([f(lambda (a0 . args) a0)]) (f 10)) "));
      TEST_EQ("12", run("(let([f(lambda (a0 . args) 12)]) (f 10 20)) "));
      TEST_EQ("10", run("(let([f(lambda (a0 . args) a0)]) (f 10 20)) "));
      TEST_EQ("12", run("(let([f(lambda (a0 . args) 12)]) (f 10 20 30)) "));
      TEST_EQ("10", run("(let([f(lambda (a0 . args) a0)]) (f 10 20 30)) "));
      TEST_EQ("12", run("(let([f(lambda (a0 . args) 12)]) (f 10 20 30 40)) "));
      TEST_EQ("10", run("(let([f(lambda (a0 . args) a0)]) (f 10 20 30 40)) "));
      TEST_EQ("#(10 20)", run("(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) "));
      TEST_EQ("#(10 20 30)", run("(let([f(lambda(a0 a1 a2 . args) (vector a0 a1 a2))]) (f 10 20 30 40 50 60 70 80 90 100)) "));
      TEST_EQ("#(10 20 30 40)", run("(let([f(lambda(a0 a1 a2 a3 . args) (vector a0 a1 a2 a3))]) (f 10 20 30 40 50 60 70 80 90 100)) "));
      TEST_EQ("#(10 20 30 40 50)", run("(let([f(lambda(a0 a1 a2 a3 a4 . args) (vector a0 a1 a2 a3 a4))]) (f 10 20 30 40 50 60 70 80 90 100)) "));
      TEST_EQ("#(10 20 30 40 50 60)", run("(let([f(lambda(a0 a1 a2 a3 a4 a5 . args) (vector a0 a1 a2 a3 a4 a5))]) (f 10 20 30 40 50 60 70 80 90 100)) "));
      }